

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O3

void __thiscall
TTD::TTDIdentifierDictionary<unsigned_long,_Js::RecyclableObject_*>::Initialize
          (TTDIdentifierDictionary<unsigned_long,_Js::RecyclableObject_*> *this,uint32 capacity)

{
  HeapAllocator *this_00;
  Entry *__s;
  size_t byteSize;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  if (this->m_hashArray != (Entry *)0x0) {
    TTDAbort_unrecoverable_error("Should not already be initialized.");
  }
  LoadValuesForHashTables(capacity * 2,&this->m_capacity,&this->m_h1Prime,&this->m_h2Prime);
  data.plusSize = (size_t)this->m_capacity;
  local_48 = (undefined1  [8])
             &TTDIdentifierDictionary<unsigned_long,Js::RecyclableObject*>::Entry::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_3fb7b9b;
  data.filename._0_4_ = 0x4c4;
  this_00 = Memory::HeapAllocator::TrackAllocInfo
                      (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_48);
  byteSize = (ulong)this->m_capacity << 4;
  __s = (Entry *)Memory::HeapAllocator::AllocT<true>(this_00,byteSize);
  if (__s != (Entry *)0x0) {
    memset(__s,0,byteSize);
    this->m_hashArray = __s;
    return;
  }
  TTDAbort_unrecoverable_error("OOM in TTD");
}

Assistant:

void Initialize(uint32 capacity)
        {
            TTDAssert(this->m_hashArray == nullptr, "Should not already be initialized.");

            uint32 desiredSize = capacity * TTD_DICTIONARY_LOAD_FACTOR;

            LoadValuesForHashTables(desiredSize, &(this->m_capacity), &(this->m_h1Prime), &(this->m_h2Prime));

            this->m_hashArray = TT_HEAP_ALLOC_ARRAY_ZERO(Entry, this->m_capacity);
        }